

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

void __thiscall QMimeAllGlobPatterns::addGlob(QMimeAllGlobPatterns *this,QMimeGlobPattern *glob)

{
  QStringView pattern_00;
  bool bVar1;
  uint uVar2;
  QMimeGlobPattern *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringList *patterns;
  QString *pattern;
  QString extension;
  parameter_type in_stack_fffffffffffffee8;
  QList<QMimeGlobPattern> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  CaseSensitivity in_stack_fffffffffffffefc;
  char16_t **str;
  QStringView *in_stack_ffffffffffffff00;
  QStringView *this_00;
  QListSpecialMethods<QString> *in_stack_ffffffffffffff08;
  QMimeGlobPatternList *in_stack_ffffffffffffff28;
  QStringView in_stack_ffffffffffffff70;
  QStringView in_stack_ffffffffffffff80;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeGlobPattern::pattern(in_RSI);
  uVar2 = QMimeGlobPattern::weight(in_RSI);
  if (uVar2 == 0x32) {
    QStringView::QStringView<QString,_true>
              (in_stack_ffffffffffffff00,
               (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    pattern_00.m_data._0_4_ = in_stack_fffffffffffffef8;
    pattern_00.m_size = (qsizetype)in_stack_fffffffffffffef0;
    pattern_00.m_data._4_4_ = in_stack_fffffffffffffefc;
    bVar1 = isFastPattern(pattern_00);
    if ((bVar1) && (bVar1 = QMimeGlobPattern::isCaseSensitive(in_RSI), !bVar1)) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QString::mid(in_RDI,(qsizetype)local_50,(qsizetype)in_stack_ffffffffffffff28);
      QString::toLower(&in_stack_fffffffffffffee8->m_pattern);
      QString::~QString((QString *)0x8ee02e);
      QHash<QString,_QList<QString>_>::operator[]
                ((QHash<QString,_QList<QString>_> *)in_stack_ffffffffffffff00,
                 (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QMimeGlobPattern::mimeType(in_RSI);
      bVar1 = QListSpecialMethods<QString>::contains
                        (in_stack_ffffffffffffff08,(QString *)in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffefc);
      if (!bVar1) {
        QMimeGlobPattern::mimeType(in_RSI);
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->m_pattern
                  );
      }
      QString::~QString((QString *)0x8ee116);
      goto LAB_008ee23d;
    }
  }
  uVar2 = QMimeGlobPattern::weight(in_RSI);
  if (uVar2 < 0x33) {
    str = &in_RDI[1].d.ptr;
    QMimeGlobPattern::mimeType(in_RSI);
    QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff00,(QString *)str);
    QMimeGlobPattern::pattern(in_RSI);
    QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff00,(QString *)str);
    bVar1 = QMimeGlobPatternList::hasPattern
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff80,in_stack_ffffffffffffff70
                      );
    if (!bVar1) {
      QList<QMimeGlobPattern>::append(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  else {
    this_00 = (QStringView *)&(in_RDI->d).ptr;
    QMimeGlobPattern::mimeType(in_RSI);
    QStringView::QStringView<QString,_true>
              (this_00,(QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QMimeGlobPattern::pattern(in_RSI);
    QStringView::QStringView<QString,_true>
              (this_00,(QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar1 = QMimeGlobPatternList::hasPattern
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff80,in_stack_ffffffffffffff70
                      );
    if (!bVar1) {
      QList<QMimeGlobPattern>::append(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
LAB_008ee23d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeAllGlobPatterns::addGlob(const QMimeGlobPattern &glob)
{
    const QString &pattern = glob.pattern();
    Q_ASSERT(!pattern.isEmpty());

    // Store each patterns into either m_fastPatternDict (*.txt, *.html etc. with default weight 50)
    // or for the rest, like core.*, *.tar.bz2, *~, into highWeightPatternOffset (>50)
    // or lowWeightPatternOffset (<=50)

    if (glob.weight() == 50 && isFastPattern(pattern) && !glob.isCaseSensitive()) {
        // The bulk of the patterns is *.foo with weight 50 --> those go into the fast patterns hash.
        const QString extension = pattern.mid(2).toLower();
        QStringList &patterns = m_fastPatterns[extension]; // find or create
        if (!patterns.contains(glob.mimeType()))
            patterns.append(glob.mimeType());
    } else {
        if (glob.weight() > 50) {
            if (!m_highWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_highWeightGlobs.append(glob);
        } else {
            if (!m_lowWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_lowWeightGlobs.append(glob);
        }
    }
}